

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function.c
# Opt level: O2

int function_increment_reference(function_conflict func)

{
  int iVar1;
  
  iVar1 = 1;
  if ((func != (function_conflict)0x0) && ((func->ref).count != 0xffffffffffffffff)) {
    LOCK();
    (func->ref).count = (func->ref).count + 1;
    UNLOCK();
    LOCK();
    function_stats.increments = function_stats.increments + 1;
    UNLOCK();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int function_increment_reference(function func)
{
	if (func == NULL)
	{
		return 1;
	}

	if (threading_atomic_ref_count_increment(&func->ref) == 1)
	{
		return 1;
	}

	reflect_memory_tracker_increment(function_stats);

	return 0;
}